

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptNativeIntArray * __thiscall
Js::JavascriptLibrary::CreateNativeIntArray(JavascriptLibrary *this,uint32 length)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *this_00;
  
  if ((this->nativeIntArrayType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1740,"(nativeIntArrayType)","Where\'s nativeIntArrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (JavascriptArray *)
            JavascriptArray::New<int,Js::JavascriptNativeIntArray,0u>
                      (length,(this->nativeIntArrayType).ptr,this->recycler);
  JavascriptArray::CheckForceES5Array(this_00);
  return (JavascriptNativeIntArray *)this_00;
}

Assistant:

JavascriptNativeIntArray* JavascriptLibrary::CreateNativeIntArray(uint32 length)
    {
        AssertMsg(nativeIntArrayType, "Where's nativeIntArrayType?");
        JavascriptNativeIntArray* arr = JavascriptArray::New<int32, JavascriptNativeIntArray, 0>(length, nativeIntArrayType, this->GetRecycler());
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }